

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  
  uVar1 = this->_sourceTextPtr;
  if (uVar1 < this->_sourceTextSize) {
    this->_sourceTextPtr = uVar1 + 1;
    bVar4 = this->_sourceText[uVar1];
  }
  else {
    this->_reached_eof = 1;
    bVar4 = 0;
  }
  this->_currdata = bVar4;
  lVar3 = this->_currentcolumn + 1;
  this->_currentcolumn = lVar3;
  iVar2 = isxdigit((uint)bVar4);
  if (iVar2 == 0) {
    iVar2 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_HEX_NUMBERS_EXPECTED,(int32_t)this->_tokenline,iVar2,(int)lVar3 - iVar2
              );
    bVar4 = this->_currdata;
  }
  iVar2 = isxdigit((uint)bVar4);
  lVar3 = 0;
  if (0 < maxdigits && iVar2 != 0) {
    do {
      dest[lVar3] = bVar4;
      uVar1 = this->_sourceTextPtr;
      if (uVar1 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar1 + 1;
        bVar4 = this->_sourceText[uVar1];
      }
      else {
        this->_reached_eof = 1;
        bVar4 = 0;
      }
      lVar3 = lVar3 + 1;
      this->_currdata = bVar4;
      this->_currentcolumn = this->_currentcolumn + 1;
      iVar2 = isxdigit((uint)bVar4);
    } while ((iVar2 != 0) && (lVar3 < maxdigits));
  }
  dest[lVar3] = '\0';
  return lVar3;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR))
        _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_NUMBERS_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}